

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fragment_uri.h
# Opt level: O0

HalfRange ktx::parseHalfRange(string_view key,string_view str)

{
  HalfRange HVar1;
  bool bVar2;
  int iVar3;
  RangeIndex RVar4;
  char *in_RCX;
  size_t in_RDX;
  exception *ex;
  uint end;
  uint begin;
  basic_string_view<char,_std::char_traits<char>_> strEnd;
  basic_string_view<char,_std::char_traits<char>_> strBegin;
  size_type indexComma;
  size_t *in_stack_fffffffffffffdb8;
  string *in_stack_fffffffffffffdc0;
  char *in_stack_fffffffffffffdc8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffdec;
  undefined4 in_stack_fffffffffffffdf0;
  RangeIndex in_stack_fffffffffffffdf4;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe00;
  RangeIndex RVar5;
  undefined4 in_stack_fffffffffffffe04;
  allocator<char> local_1b1;
  string local_1b0 [43];
  byte local_185;
  byte local_172;
  undefined1 local_171 [37];
  RangeIndex local_14c;
  basic_string_view<char,_std::char_traits<char>_> local_148;
  basic_string_view<char,_std::char_traits<char>_> local_138;
  size_type local_128;
  size_t local_120;
  char *local_118;
  
  local_120 = in_RDX;
  local_118 = in_RCX;
  local_128 = std::basic_string_view<char,_std::char_traits<char>_>::find
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                         (char)((uint)in_stack_fffffffffffffdec >> 0x18),
                         (size_type)in_stack_fffffffffffffde0);
  if (local_128 == 0xffffffffffffffff) {
    local_138._M_str = local_118;
    local_138._M_len = local_120;
  }
  else {
    local_138 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                          (in_stack_fffffffffffffde0,
                           CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                           (size_type)in_stack_fffffffffffffdd0);
  }
  if (local_128 == 0xffffffffffffffff) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  }
  else {
    local_148 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                          (in_stack_fffffffffffffde0,
                           CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                           (size_type)in_stack_fffffffffffffdd0);
  }
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_138);
  local_172 = 0;
  local_185 = 0;
  if (bVar2) {
    RVar4 = 0;
  }
  else {
    in_stack_fffffffffffffdf8 = (basic_string_view<char,_std::char_traits<char>_> *)local_171;
    std::allocator<char>::allocator();
    local_172 = 1;
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
               in_stack_fffffffffffffdf8,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
    local_185 = 1;
    in_stack_fffffffffffffdf4 =
         std::__cxx11::stoi(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,0);
    RVar4 = in_stack_fffffffffffffdf4;
  }
  RVar5 = RVar4;
  if ((local_185 & 1) != 0) {
    std::__cxx11::string::~string((string *)(local_171 + 1));
  }
  if ((local_172 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)local_171);
  }
  local_14c = RVar4;
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_148);
  if (bVar2) {
    RVar4 = 0xffffffff;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe04,RVar5),in_stack_fffffffffffffdf8,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffdf4,RVar4));
    iVar3 = std::__cxx11::stoi(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,0);
    RVar4 = iVar3 + 1;
    std::__cxx11::string::~string(local_1b0);
    std::allocator<char>::~allocator(&local_1b1);
  }
  HVar1.end = RVar4;
  HVar1.begin = local_14c;
  return HVar1;
}

Assistant:

[[nodiscard]] inline SelectorRange::HalfRange parseHalfRange(std::string_view key, std::string_view str) {
    const auto indexComma = str.find(',');
    const auto strBegin = indexComma == std::string_view::npos ? str : str.substr(0, indexComma);
    const auto strEnd = indexComma == std::string_view::npos ? "" : str.substr(indexComma + 1);

    try {
        const auto begin = strBegin.empty() ? 0u : static_cast<uint32_t>(std::stoi(std::string(strBegin)));
        const auto end = strEnd.empty() ? RangeEnd : static_cast<uint32_t>(std::stoi(std::string(strEnd))) + 1u;
        return {begin, end};
    } catch (const std::exception& ex) {
        throw std::invalid_argument(fmt::format("Invalid key-value \"{}={}\": {}", key, str, ex.what()));
    }
}